

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ValueSymbol.h
# Opt level: O0

subrange<slang::IntervalMap<unsigned_long,_const_slang::ast::ValueDriver_*,_0U>::const_iterator,_slang::IntervalMap<unsigned_long,_const_slang::ast::ValueDriver_*,_0U>::const_iterator,_(std::ranges::subrange_kind)0>
* __thiscall slang::ast::ValueSymbol::drivers(ValueSymbol *this)

{
  long in_RSI;
  IntervalMap<unsigned_long,_const_slang::ast::ValueDriver_*,_0U> *this_00;
  subrange<slang::IntervalMap<unsigned_long,_const_slang::ast::ValueDriver_*,_0U>::const_iterator,_slang::IntervalMap<unsigned_long,_const_slang::ast::ValueDriver_*,_0U>::const_iterator,_(std::ranges::subrange_kind)0>
  *in_RDI;
  const_iterator *in_stack_fffffffffffffef8;
  subrange<slang::IntervalMap<unsigned_long,_const_slang::ast::ValueDriver_*,_0U>::const_iterator,_slang::IntervalMap<unsigned_long,_const_slang::ast::ValueDriver_*,_0U>::const_iterator,_(std::ranges::subrange_kind)0>
  *in_stack_ffffffffffffff20;
  const_iterator local_90 [2];
  
  this_00 = (IntervalMap<unsigned_long,_const_slang::ast::ValueDriver_*,_0U> *)(in_RSI + 0x80);
  IntervalMap<unsigned_long,_const_slang::ast::ValueDriver_*,_0U>::begin(this_00);
  IntervalMap<unsigned_long,_const_slang::ast::ValueDriver_*,_0U>::end(this_00);
  IntervalMap<unsigned_long,_const_slang::ast::ValueDriver_*,_0U>::const_iterator::const_iterator
            (local_90,in_stack_fffffffffffffef8);
  std::ranges::
  subrange<slang::IntervalMap<unsigned_long,_const_slang::ast::ValueDriver_*,_0U>::const_iterator,_slang::IntervalMap<unsigned_long,_const_slang::ast::ValueDriver_*,_0U>::const_iterator,_(std::ranges::subrange_kind)0>
  ::subrange<slang::IntervalMap<unsigned_long,_const_slang::ast::ValueDriver_*,_0U>::iterator>
            (in_stack_ffffffffffffff20,(iterator *)this_00,&in_RDI->_M_begin);
  IntervalMap<unsigned_long,_const_slang::ast::ValueDriver_*,_0U>::const_iterator::~const_iterator
            ((const_iterator *)0x4e202a);
  IntervalMap<unsigned_long,_const_slang::ast::ValueDriver_*,_0U>::iterator::~iterator
            ((iterator *)0x4e2034);
  IntervalMap<unsigned_long,_const_slang::ast::ValueDriver_*,_0U>::iterator::~iterator
            ((iterator *)0x4e2041);
  return in_RDI;
}

Assistant:

std::ranges::subrange<DriverIntervalMap::const_iterator> drivers() const {
        return {driverMap.begin(), driverMap.end()};
    }